

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

qint64 __thiscall QHttpPartPrivate::readData(QHttpPartPrivate *this,char *data,qint64 maxSize)

{
  qsizetype qVar1;
  size_t *psVar2;
  char *pcVar3;
  size_t __n;
  qsizetype qVar4;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *contentData;
  qint64 contentBytesRead;
  qint64 dataBytesRead;
  char *headerData;
  qint64 headerDataCount;
  qint64 bytesRead;
  QHttpPartPrivate *in_stack_ffffffffffffff90;
  size_t local_48;
  size_t local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  checkHeaderCreated(in_stack_ffffffffffffff90);
  local_48 = 0;
  qVar1 = QByteArray::size((QByteArray *)(in_RDI + 0x70));
  if (*(long *)(in_RDI + 0x90) < qVar1) {
    local_18 = qVar1 - *(long *)(in_RDI + 0x90);
    psVar2 = (size_t *)qMin<long_long>(&local_18,&local_10);
    local_48 = *psVar2;
    pcVar3 = QByteArray::constData((QByteArray *)0x2e3c27);
    memcpy(in_RSI,pcVar3 + *(long *)(in_RDI + 0x90),local_48);
    *(size_t *)(in_RDI + 0x90) = local_48 + *(long *)(in_RDI + 0x90);
  }
  if ((long)local_48 < local_10) {
    if (*(long *)(in_RDI + 0x68) == 0) {
      qVar4 = QByteArray::size((QByteArray *)(in_RDI + 0x50));
      local_20 = (qVar4 - *(long *)(in_RDI + 0x90)) + qVar1;
      local_28 = local_10 - local_48;
      psVar2 = (size_t *)qMin<long_long>(&local_20,&local_28);
      __n = *psVar2;
      pcVar3 = QByteArray::constData((QByteArray *)0x2e3d44);
      memcpy((void *)((long)in_RSI + local_48),pcVar3 + (*(long *)(in_RDI + 0x90) - qVar1),__n);
      *(size_t *)(in_RDI + 0x90) = __n + *(long *)(in_RDI + 0x90);
    }
    else {
      __n = QIODevice::read(*(char **)(in_RDI + 0x68),(long)in_RSI + local_48);
      if (__n == 0xffffffffffffffff) {
        local_30 = 0xffffffffffffffff;
        goto LAB_002e3dae;
      }
      *(size_t *)(in_RDI + 0x90) = __n + *(long *)(in_RDI + 0x90);
    }
    local_48 = __n + local_48;
  }
  local_30 = local_48;
LAB_002e3dae:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpPartPrivate::readData(char *data, qint64 maxSize)
{
    checkHeaderCreated();
    qint64 bytesRead = 0;
    qint64 headerDataCount = header.size();

    // read header if it has not been read yet
    if (readPointer < headerDataCount) {
        bytesRead = qMin(headerDataCount - readPointer, maxSize);
        const char *headerData = header.constData();
        memcpy(data, headerData + readPointer, bytesRead);
        readPointer += bytesRead;
    }
    // read content if there is still space
    if (bytesRead < maxSize) {
        if (bodyDevice) {
            qint64 dataBytesRead = bodyDevice->read(data + bytesRead, maxSize - bytesRead);
            if (dataBytesRead == -1)
                return -1;
            bytesRead += dataBytesRead;
            readPointer += dataBytesRead;
        } else {
            qint64 contentBytesRead = qMin(body.size() - readPointer + headerDataCount, maxSize - bytesRead);
            const char *contentData = body.constData();
            // if this method is called several times, we need to find the
            // right offset in the content ourselves:
            memcpy(data + bytesRead, contentData + readPointer - headerDataCount, contentBytesRead);
            bytesRead += contentBytesRead;
            readPointer += contentBytesRead;
        }
    }
    return bytesRead;
}